

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>
::
_container_insert<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
          (Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>
           *this,vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *column,Index pos,Dimension dim)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true>_>_>
  local_48;
  uint local_20;
  Index local_1c;
  Dimension dim_local;
  Index pos_local;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *column_local;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true>_>_>
  *this_local;
  
  local_20 = dim;
  local_1c = pos;
  _dim_local = column;
  column_local = (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)this;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>
  ::
  Intrusive_list_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>
              *)&local_48,column,dim,*(Column_settings **)(this + 0x60));
  std::
  unordered_map<unsigned_int,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>>>>
  ::
  try_emplace<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>>
            ((unordered_map<unsigned_int,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true>>>>>>
              *)(this + 0x20),&local_1c,&local_48);
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true>_>_>
  ::~Intrusive_list_column(&local_48);
  Matrix_all_dimension_holder<int>::update_up((Matrix_all_dimension_holder<int> *)this,local_20);
  return;
}

Assistant:

inline void Boundary_matrix<Master_matrix>::_container_insert(const Container& column,
                                                              Index pos,
                                                              Dimension dim)
{
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.try_emplace(pos, Column(pos, column, dim, RA_opt::rows_, colSettings_));
    } else {
      matrix_.try_emplace(pos, Column(column, dim, colSettings_));
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.emplace_back(pos, column, dim, RA_opt::rows_, colSettings_);
    } else {
      if (matrix_.size() <= pos) {
        matrix_.emplace_back(column, dim, colSettings_);
      } else {
        matrix_[pos] = Column(column, dim, colSettings_);
      }
    }
  }
  if constexpr (activeDimOption) {
    Dim_opt::update_up(dim);
  }
}